

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

void __thiscall caffe::LayerParameter::add_bottom(LayerParameter *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *value_local;
  LayerParameter *this_local;
  
  pbVar1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(&this->bottom_);
  std::__cxx11::string::assign((string *)pbVar1);
  return;
}

Assistant:

inline void LayerParameter::add_bottom(const ::std::string& value) {
  bottom_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:caffe.LayerParameter.bottom)
}